

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Cone(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Ptr_t *pVVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined4 extraout_var_00;
  Gia_Man_t *pGVar6;
  Vec_Int_t *p;
  int iVar7;
  char *pcVar8;
  uint fVerbose;
  uint local_54;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 extraout_var;
  
  local_4c = 0;
  Extra_UtilGetoptReset();
  local_48 = 1;
  local_40 = 0xffffffff;
  local_54 = 0xffffffff;
  local_50 = 0;
  bVar2 = false;
  fVerbose = 0;
LAB_0022ebf7:
  while (iVar3 = Extra_UtilGetopt(argc,argv,"ORPLWavh"), iVar7 = globalUtilOptind, iVar3 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  switch(iVar3) {
  case 0x4c:
    if (argc <= globalUtilOptind) {
      pcVar8 = "Command line switch \"-L\" should be followed by an integer.\n";
      break;
    }
    local_4c = atoi(argv[globalUtilOptind]);
    uVar4 = local_4c;
joined_r0x0022ecd0:
    globalUtilOptind = iVar7 + 1;
    if ((int)uVar4 < 0) {
switchD_0022ec25_caseD_4d:
      Abc_Print(-2,"usage: &cone [-ORPLW num] [-avh]\n");
      Abc_Print(-2,"\t         extracting multi-output sequential logic cones\n");
      Abc_Print(-2,"\t-O num : the index of first PO to extract [default = %d]\n",local_40);
      Abc_Print(-2,"\t-R num : (optional) the number of outputs to extract [default = %d]\n",
                local_48);
      Abc_Print(-2,"\t-P num : (optional) the partition number to extract [default = %d]\n",
                (ulong)local_54);
      Abc_Print(-2,"\t-L num : (optional) extract cones with higher level [default = %d]\n",
                (ulong)local_4c);
      Abc_Print(-2,"\t-W num : (optional) extract cones falling into this window [default = %d]\n",
                (ulong)local_50);
      pcVar8 = "all";
      if (!bVar2) {
        pcVar8 = "structural";
      }
      Abc_Print(-2,"\t-a     : toggle keeping all CIs or structral support only [default = %s]\n",
                pcVar8);
      pcVar8 = "yes";
      if (fVerbose == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar8);
      pcVar8 = "\t-h     : print the command usage\n";
      iVar7 = -2;
LAB_0022ef2d:
      Abc_Print(iVar7,pcVar8);
      return 1;
    }
    goto LAB_0022ebf7;
  case 0x4d:
  case 0x4e:
  case 0x51:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
    goto switchD_0022ec25_caseD_4d;
  case 0x4f:
    if (globalUtilOptind < argc) {
      iVar3 = atoi(argv[globalUtilOptind]);
      uVar5 = CONCAT44(extraout_var_00,iVar3);
      local_40 = uVar5;
LAB_0022ecce:
      uVar4 = (uint)uVar5;
      goto joined_r0x0022ecd0;
    }
    pcVar8 = "Command line switch \"-O\" should be followed by an integer.\n";
    break;
  case 0x50:
    if (globalUtilOptind < argc) {
      local_54 = atoi(argv[globalUtilOptind]);
      uVar4 = local_54;
      goto joined_r0x0022ecd0;
    }
    pcVar8 = "Command line switch \"-P\" should be followed by an integer.\n";
    break;
  case 0x52:
    if (globalUtilOptind < argc) {
      iVar3 = atoi(argv[globalUtilOptind]);
      uVar5 = CONCAT44(extraout_var,iVar3);
      local_48 = uVar5;
      goto LAB_0022ecce;
    }
    pcVar8 = "Command line switch \"-R\" should be followed by an integer.\n";
    break;
  case 0x57:
    if (globalUtilOptind < argc) {
      local_50 = atoi(argv[globalUtilOptind]);
      uVar4 = local_50;
      goto joined_r0x0022ecd0;
    }
    pcVar8 = "Command line switch \"-W\" should be followed by an integer.\n";
    break;
  default:
    if (iVar3 == -1) {
      pGVar6 = pAbc->pGia;
      if (pGVar6 == (Gia_Man_t *)0x0) {
        pcVar8 = "Abc_CommandAbc9Cone(): There is no AIG.\n";
      }
      else if (local_4c == 0 && local_50 == 0) {
        if ((int)local_54 < 0) {
          iVar7 = (int)local_40;
          if ((-1 < iVar7) &&
             (iVar3 = (int)local_48, iVar3 + iVar7 <= pGVar6->vCos->nSize - pGVar6->nRegs)) {
            p = Vec_IntStartRange(iVar7,iVar3);
            pGVar6 = Gia_ManDupCones(pAbc->pGia,p->pArray,iVar3,(uint)!bVar2);
            Vec_IntFree(p);
joined_r0x0022ef88:
            if (pGVar6 == (Gia_Man_t *)0x0) {
              return 0;
            }
            Abc_FrameUpdateGia(pAbc,pGVar6);
            return 0;
          }
          pcVar8 = "Abc_CommandAbc9Cone(): Range of outputs to extract is incorrect.\n";
        }
        else {
          pVVar1 = pAbc->vPoEquivs;
          if (pVVar1 == (Vec_Ptr_t *)0x0) {
            pcVar8 = "Abc_CommandAbc9Cone(): Partitions are not defined.\n";
          }
          else {
            if ((int)local_54 < pVVar1->nSize) {
              pGVar6 = Gia_ManDupCones(pGVar6,*(int **)((long)pVVar1->pArray[local_54] + 8),
                                       *(int *)((long)pVVar1->pArray[local_54] + 4),(uint)!bVar2);
              goto joined_r0x0022ef88;
            }
            pcVar8 = "Abc_CommandAbc9Cone(): Partition index exceed the array size.\n";
          }
        }
      }
      else {
        if ((local_4c == 0) || (local_50 == 0)) {
          pGVar6 = Gia_ManExtractWindow(pGVar6,local_4c,local_50,fVerbose);
          Abc_FrameUpdateGia(pAbc,pGVar6);
          return 0;
        }
        pcVar8 = 
        "Abc_CommandAbc9Cone(): Parameters -L (max level) and -W (timing window) cannot be specified at the same time.\n"
        ;
      }
      iVar7 = -1;
      goto LAB_0022ef2d;
    }
    if (iVar3 != 0x61) goto switchD_0022ec25_caseD_4d;
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_0022ebf7;
  }
  Abc_Print(-1,pcVar8);
  goto switchD_0022ec25_caseD_4d;
}

Assistant:

int Abc_CommandAbc9Cone( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    Vec_Int_t * vPos;
    int c, iOutNum = -1, nOutRange = 1, iPartNum = -1, nLevelMax = 0, nTimeWindow = 0, fUseAllCis = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ORPLWavh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            iOutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iOutNum < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutRange = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutRange < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            iPartNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iPartNum < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevelMax < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeWindow = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeWindow < 0 )
                goto usage;
            break;
        case 'a':
            fUseAllCis ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cone(): There is no AIG.\n" );
        return 1;
    }
    if ( nLevelMax || nTimeWindow )
    {
        if ( nLevelMax && nTimeWindow )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Parameters -L (max level) and -W (timing window) cannot be specified at the same time.\n" );
            return 1;
        }
        else
        {
            pTemp = Gia_ManExtractWindow( pAbc->pGia, nLevelMax, nTimeWindow, fVerbose );
            Abc_FrameUpdateGia( pAbc, pTemp );
            return 0;
        }
    }
    if ( iPartNum >= 0 )
    {
        Vec_Int_t * vClass;
        Vec_Vec_t * vClasses = (Vec_Vec_t *)pAbc->vPoEquivs;
        if ( vClasses == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Partitions are not defined.\n" );
            return 1;
        }
        if ( iPartNum >= Vec_VecSize(vClasses) )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Partition index exceed the array size.\n" );
            return 1;
        }
        vClass = Vec_VecEntryInt( vClasses, iPartNum );
        pTemp = Gia_ManDupCones( pAbc->pGia, Vec_IntArray(vClass), Vec_IntSize(vClass), !fUseAllCis );
        if ( pTemp )
            Abc_FrameUpdateGia( pAbc, pTemp );
        return 0;
    }
    if ( iOutNum < 0 || iOutNum + nOutRange > Gia_ManPoNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cone(): Range of outputs to extract is incorrect.\n" );
        return 1;
    }
    vPos = Vec_IntStartRange( iOutNum, nOutRange );
    pTemp = Gia_ManDupCones( pAbc->pGia, Vec_IntArray(vPos), nOutRange, !fUseAllCis );
    Vec_IntFree( vPos );
    if ( pTemp )
        Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &cone [-ORPLW num] [-avh]\n" );
    Abc_Print( -2, "\t         extracting multi-output sequential logic cones\n" );
    Abc_Print( -2, "\t-O num : the index of first PO to extract [default = %d]\n", iOutNum );
    Abc_Print( -2, "\t-R num : (optional) the number of outputs to extract [default = %d]\n", nOutRange );
    Abc_Print( -2, "\t-P num : (optional) the partition number to extract [default = %d]\n", iPartNum );
    Abc_Print( -2, "\t-L num : (optional) extract cones with higher level [default = %d]\n", nLevelMax );
    Abc_Print( -2, "\t-W num : (optional) extract cones falling into this window [default = %d]\n", nTimeWindow );
    Abc_Print( -2, "\t-a     : toggle keeping all CIs or structral support only [default = %s]\n", fUseAllCis? "all": "structural" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}